

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directives.cpp
# Opt level: O2

bool DirectiveMessage(ArgumentList *List,int flags)

{
  bool bVar1;
  CDirectiveMessage *this;
  
  if (flags - 1U < 3) {
    this = (CDirectiveMessage *)operator_new(0x38);
    CDirectiveMessage::CDirectiveMessage(this);
    bVar1 = CDirectiveMessage::Load(this,List,flags);
    if (bVar1) {
      AddAssemblerCommand((CAssemblerCommand *)0x140146);
      return true;
    }
    (*(this->super_CAssemblerCommand)._vptr_CAssemblerCommand[1])(this);
  }
  return false;
}

Assistant:

bool DirectiveMessage(ArgumentList& List, int flags)
{
	CDirectiveMessage::Type value;

	switch (flags)
	{
	case DIRECTIVE_MSG_WARNING:		value = CDirectiveMessage::Type::Warning;	break;
	case DIRECTIVE_MSG_ERROR:		value = CDirectiveMessage::Type::Error;		break;
	case DIRECTIVE_MSG_NOTICE:		value = CDirectiveMessage::Type::Notice;	break;
	default: return false;
	}

	CDirectiveMessage* Command = new CDirectiveMessage();
	if (Command->Load(List,value) == false)
	{
		delete Command;
		return false;
	}

	AddAssemblerCommand(Command);
	return true;
}